

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_write__pulse
                    (ma_device *pDevice,void *pPCMFrames,ma_uint32 frameCount,
                    ma_uint32 *pFramesWritten)

{
  void **ppvVar1;
  ma_uint32 *pmVar2;
  void *pvVar3;
  ma_uint32 mVar4;
  ma_result mVar5;
  ma_result mVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ma_result unaff_R14D;
  uint uVar11;
  size_t bytesToMap;
  ma_uint32 *local_40;
  void *local_38;
  
  local_38 = pPCMFrames;
  if (pPCMFrames == (void *)0x0) {
    __assert_fail("pPCMFrames != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4db2,
                  "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                 );
  }
  if (frameCount == 0) {
    __assert_fail("frameCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4db3,
                  "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                 );
  }
  if (pFramesWritten != (ma_uint32 *)0x0) {
    *pFramesWritten = 0;
  }
  ppvVar1 = &(pDevice->field_23).pulse.pMappedBufferPlayback;
  uVar9 = 0;
  local_40 = pFramesWritten;
LAB_0010d09d:
  do {
    uVar11 = frameCount - uVar9;
    uVar10 = uVar9;
    if (frameCount < uVar9 || uVar11 == 0) {
LAB_0010d2b8:
      if (local_40 == (ma_uint32 *)0x0) {
        return 0;
      }
      *local_40 = uVar10;
      return 0;
    }
    if (pDevice->state != 2) {
      return -0xca;
    }
    pvVar3 = *ppvVar1;
    if ((pvVar3 != (void *)0x0) &&
       (uVar10 = (pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback, uVar10 != 0)) {
      iVar8 = *(int *)(&DAT_001127b0 + (ulong)(pDevice->playback).internalFormat * 4) *
              (pDevice->playback).internalChannels;
      pFramesWritten =
           (ma_uint32 *)
           (ulong)(((pDevice->field_23).pulse.mappedBufferFramesCapacityPlayback - uVar10) * iVar8);
      if (uVar10 < uVar11) {
        uVar11 = uVar10;
      }
      memcpy((void *)((long)pvVar3 + (long)pFramesWritten),
             (void *)((ulong)(iVar8 * uVar9) + (long)local_38),(ulong)(iVar8 * uVar11));
      pmVar2 = &(pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback;
      *pmVar2 = *pmVar2 - uVar11;
      uVar9 = uVar9 + uVar11;
    }
    mVar4 = (pDevice->field_23).pulse.mappedBufferFramesCapacityPlayback;
    if ((mVar4 != 0) && ((pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback == 0)) {
      pFramesWritten = (ma_uint32 *)0x0;
      iVar8 = (*(pDevice->pContext->field_21).alsa.snd_device_name_hint)
                        ((pDevice->field_23).pulse.pStreamPlayback,
                         (pDevice->field_23).pulse.pMappedBufferPlayback,
                         (ulong)(mVar4 * (pDevice->playback).internalChannels *
                                *(int *)(&DAT_001127b0 +
                                        (ulong)(pDevice->playback).internalFormat * 4)),0,0,0);
      mVar5 = (ma_result)pFramesWritten;
      if (iVar8 < 0) {
        mVar6 = ma_result_from_pulse(iVar8);
        ma_post_error(pDevice,1,"[PulseAudio] Failed to write data to the PulseAudio stream.",mVar5)
        ;
        return mVar6;
      }
      (pDevice->field_23).pulse.pMappedBufferPlayback = (void *)0x0;
      (pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback = 0;
      (pDevice->field_23).pulse.mappedBufferFramesCapacityPlayback = 0;
    }
    if (frameCount <= uVar9 && uVar9 != frameCount) {
      __assert_fail("totalFramesWritten <= frameCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x4dde,
                    "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                   );
    }
    uVar10 = frameCount;
    if (uVar9 == frameCount) goto LAB_0010d2b8;
    do {
      iVar8 = (*(pDevice->pContext->field_21).alsa.snd_pcm_prepare)
                        ((pDevice->field_23).pulse.pStreamPlayback);
      mVar5 = (ma_result)pFramesWritten;
      if (iVar8 != 0) goto LAB_0010d09d;
      sVar7 = (*(pDevice->pContext->field_21).alsa.snd_device_name_free_hint)
                        ((pDevice->field_23).pulse.pStreamPlayback);
      if (sVar7 == 0) {
        iVar8 = (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_any)
                          ((pDevice->field_23).alsa.pPCMPlayback,1,0);
        pFramesWritten = (ma_uint32 *)0x5;
        if (iVar8 < 0) {
          mVar5 = ma_result_from_pulse(iVar8);
          return mVar5;
        }
      }
      else {
        if (sVar7 == 0xffffffffffffffff) {
          ma_post_error(pDevice,1,"[PulseAudio] Failed to query the stream\'s writable size.",mVar5)
          ;
          return -1;
        }
        bytesToMap = sVar7;
        iVar8 = (*(pDevice->pContext->field_21).alsa.snd_pcm_drain)
                          ((pDevice->field_23).pulse.pStreamPlayback,ppvVar1,&bytesToMap);
        if (iVar8 < 0) {
          unaff_R14D = ma_result_from_pulse(iVar8);
          ma_post_error(pDevice,1,"[PulseAudio] Failed to map write buffer.",mVar5);
          pFramesWritten = (ma_uint32 *)0x1;
        }
        else {
          mVar4 = (ma_uint32)
                  (bytesToMap /
                  (*(int *)(&DAT_001127b0 + (ulong)(pDevice->playback).internalFormat * 4) *
                  (pDevice->playback).internalChannels));
          (pDevice->field_23).pulse.mappedBufferFramesCapacityPlayback = mVar4;
          (pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback = mVar4;
          pFramesWritten = (ma_uint32 *)0x4;
        }
      }
    } while ((int)pFramesWritten == 5);
    if ((int)pFramesWritten != 4) {
      return unaff_R14D;
    }
  } while( true );
}

Assistant:

static ma_result ma_device_write__pulse(ma_device* pDevice, const void* pPCMFrames, ma_uint32 frameCount, ma_uint32* pFramesWritten)
{
    ma_uint32 totalFramesWritten;

    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(pPCMFrames != NULL);
    MA_ASSERT(frameCount > 0);

    if (pFramesWritten != NULL) {
        *pFramesWritten = 0;
    }

    totalFramesWritten = 0;
    while (totalFramesWritten < frameCount) {
        if (ma_device__get_state(pDevice) != MA_STATE_STARTED) {
            return MA_DEVICE_NOT_STARTED;
        }

        /* Place the data into the mapped buffer if we have one. */
        if (pDevice->pulse.pMappedBufferPlayback != NULL && pDevice->pulse.mappedBufferFramesRemainingPlayback > 0) {
            ma_uint32 bpf = ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
            ma_uint32 mappedBufferFramesConsumed = pDevice->pulse.mappedBufferFramesCapacityPlayback - pDevice->pulse.mappedBufferFramesRemainingPlayback;

            void* pDst = (ma_uint8*)pDevice->pulse.pMappedBufferPlayback + (mappedBufferFramesConsumed * bpf);
            const void* pSrc = (const ma_uint8*)pPCMFrames + (totalFramesWritten * bpf);
            ma_uint32  framesToCopy = ma_min(pDevice->pulse.mappedBufferFramesRemainingPlayback, (frameCount - totalFramesWritten));
            MA_COPY_MEMORY(pDst, pSrc, framesToCopy * bpf);

            pDevice->pulse.mappedBufferFramesRemainingPlayback -= framesToCopy;
            totalFramesWritten += framesToCopy;
        }

        /*
        Getting here means we've run out of data in the currently mapped chunk. We need to write this to the device and then try
        mapping another chunk. If this fails we need to wait for space to become available.
        */
        if (pDevice->pulse.mappedBufferFramesCapacityPlayback > 0 && pDevice->pulse.mappedBufferFramesRemainingPlayback == 0) {
            size_t nbytes = pDevice->pulse.mappedBufferFramesCapacityPlayback * ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);

            int error = ((ma_pa_stream_write_proc)pDevice->pContext->pulse.pa_stream_write)((ma_pa_stream*)pDevice->pulse.pStreamPlayback, pDevice->pulse.pMappedBufferPlayback, nbytes, NULL, 0, MA_PA_SEEK_RELATIVE);
            if (error < 0) {
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to write data to the PulseAudio stream.", ma_result_from_pulse(error));
            }

            pDevice->pulse.pMappedBufferPlayback = NULL;
            pDevice->pulse.mappedBufferFramesRemainingPlayback = 0;
            pDevice->pulse.mappedBufferFramesCapacityPlayback = 0;
        }

        MA_ASSERT(totalFramesWritten <= frameCount);
        if (totalFramesWritten == frameCount) {
            break;
        }

        /* Getting here means we need to map a new buffer. If we don't have enough space we need to wait for more. */
        for (;;) {
            size_t writableSizeInBytes;

            /* If the device has been corked, don't try to continue. */
            if (((ma_pa_stream_is_corked_proc)pDevice->pContext->pulse.pa_stream_is_corked)((ma_pa_stream*)pDevice->pulse.pStreamPlayback)) {
                break;
            }

            writableSizeInBytes = ((ma_pa_stream_writable_size_proc)pDevice->pContext->pulse.pa_stream_writable_size)((ma_pa_stream*)pDevice->pulse.pStreamPlayback);
            if (writableSizeInBytes != (size_t)-1) {
                if (writableSizeInBytes > 0) {
                    /* Data is avaialable. */
                    size_t bytesToMap = writableSizeInBytes;
                    int error = ((ma_pa_stream_begin_write_proc)pDevice->pContext->pulse.pa_stream_begin_write)((ma_pa_stream*)pDevice->pulse.pStreamPlayback, &pDevice->pulse.pMappedBufferPlayback, &bytesToMap);
                    if (error < 0) {
                        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to map write buffer.", ma_result_from_pulse(error));
                    }

                    pDevice->pulse.mappedBufferFramesCapacityPlayback  = bytesToMap / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    pDevice->pulse.mappedBufferFramesRemainingPlayback = pDevice->pulse.mappedBufferFramesCapacityPlayback;

                    break;
                } else {
                    /* No data available. Need to wait for more. */
                    int error = ((ma_pa_mainloop_iterate_proc)pDevice->pContext->pulse.pa_mainloop_iterate)((ma_pa_mainloop*)pDevice->pulse.pMainLoop, 1, NULL);
                    if (error < 0) {
                        return ma_result_from_pulse(error);
                    }

                    continue;
                }
            } else {
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to query the stream's writable size.", MA_ERROR);
            }
        }
    }

    if (pFramesWritten != NULL) {
        *pFramesWritten = totalFramesWritten;
    }

    return MA_SUCCESS;
}